

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O3

void MSDsort(string *strings,size_t scnt)

{
  list a;
  list plVar1;
  size_t sVar2;
  ulong uVar3;
  list plVar4;
  
  a = (list)calloc(scnt,0x18);
  if (scnt == 0) {
    MSD1(a,0);
  }
  else {
    uVar3 = 0;
    plVar1 = a;
    do {
      plVar1->str = strings[uVar3];
      plVar4 = (list)0x0;
      if (uVar3 < scnt - 1) {
        plVar4 = plVar1 + 1;
      }
      plVar1->next = plVar4;
      uVar3 = uVar3 + 1;
      plVar1 = plVar1 + 1;
    } while (scnt != uVar3);
    plVar1 = MSD1(a,(int)scnt);
    sVar2 = 0;
    do {
      strings[sVar2] = plVar1->str;
      sVar2 = sVar2 + 1;
      plVar1 = plVar1->next;
    } while (scnt != sVar2);
  }
  free(a);
  return;
}

Assistant:

void MSDsort(string strings[], size_t scnt)
{
   list ptr, listnodes;
   size_t i;

    /* allocate memory based on the number of strings in the array */
    ptr = listnodes = (list ) calloc(scnt, sizeof(struct listrec));

    /* point the linked list nodes to the strings in the array */
    for( i=0; i<scnt; i++)
    {
        listnodes[i].str = strings[i];
        if (i<(scnt-1))
           listnodes[i].next = &listnodes[i+1];
        else
           listnodes[i].next = NULL;
    }

    /* sort */
    listnodes = MSD1(listnodes, scnt);

    /* write the strings back into the array */
    for (i = 0;  i < scnt ; i++, listnodes=listnodes->next)
       strings[i] = listnodes->str;

    free(ptr);
}